

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolUDP.cpp
# Opt level: O0

void __thiscall
ProtocolUDP::Transmit
          (ProtocolUDP *this,DataBuffer *buffer,uint8_t *targetIP,uint16_t targetPort,
          uint8_t *sourceIP,uint16_t sourcePort)

{
  uint8_t *p;
  uint16_t value;
  uint32_t uVar1;
  size_t sVar2;
  uint8_t local_36 [2];
  uint32_t acc;
  uint8_t pheader_tmp [4];
  uint8_t *puStack_30;
  uint16_t sourcePort_local;
  uint8_t *sourceIP_local;
  uint16_t targetPort_local;
  uint8_t *targetIP_local;
  DataBuffer *buffer_local;
  ProtocolUDP *this_local;
  
  acc._2_2_ = sourcePort;
  puStack_30 = sourceIP;
  sVar2 = header_size();
  buffer->Packet = buffer->Packet + -sVar2;
  sVar2 = header_size();
  buffer->Remainder = buffer->Remainder + (short)sVar2;
  Pack16(buffer->Packet,0,acc._2_2_);
  Pack16(buffer->Packet,2,targetPort);
  Pack16(buffer->Packet,4,buffer->Length);
  local_36[0] = '\0';
  local_36[1] = 0x11;
  Pack16(local_36,2,buffer->Length);
  FCS::ChecksumAdd(puStack_30,4,0);
  uVar1 = FCS::ChecksumAdd(targetIP,4,0);
  uVar1 = FCS::ChecksumAdd(local_36,4,uVar1);
  uVar1 = FCS::ChecksumAdd(buffer->Packet,(uint)buffer->Length,uVar1);
  p = buffer->Packet;
  value = FCS::ChecksumComplete(uVar1);
  Pack16(p,6,value);
  ProtocolIPv4::Transmit(this->IP,buffer,'\x11',targetIP,puStack_30);
  return;
}

Assistant:

void ProtocolUDP::Transmit(DataBuffer* buffer,
                           const uint8_t* targetIP,
                           uint16_t targetPort,
                           const uint8_t* sourceIP,
                           uint16_t sourcePort)
{
    buffer->Packet -= header_size();
    buffer->Remainder += header_size();

    Pack16(buffer->Packet, 0, sourcePort);
    Pack16(buffer->Packet, 2, targetPort);
    Pack16(buffer->Packet, 4, buffer->Length);

    // Calculate checksum
    uint8_t pheader_tmp[4];
    pheader_tmp[0] = 0;
    pheader_tmp[1] = 0x11;
    Pack16(pheader_tmp, 2, buffer->Length);
    uint32_t acc = 0;
    FCS::ChecksumAdd(sourceIP, 4, acc);
    acc = FCS::ChecksumAdd(targetIP, 4, acc);
    acc = FCS::ChecksumAdd(pheader_tmp, 4, acc);
    acc = FCS::ChecksumAdd(buffer->Packet, buffer->Length, acc);
    Pack16(buffer->Packet, 6, FCS::ChecksumComplete(acc));

    IP.Transmit(buffer, 0x11, targetIP, sourceIP);
}